

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O2

size_t flatbuffers::InlineSize(Type *type)

{
  BaseType t;
  size_t sVar1;
  Type local_28;
  
  t = type->base_type;
  if (t == BASE_TYPE_STRUCT) {
    if (type->struct_def->fixed != true) {
LAB_0012a03d:
      sVar1 = SizeOf(t);
      return sVar1;
    }
    sVar1 = type->struct_def->bytesize;
  }
  else {
    if (t != BASE_TYPE_ARRAY) goto LAB_0012a03d;
    local_28.base_type = type->element;
    local_28.fixed_length = type->fixed_length;
    local_28.element = BASE_TYPE_NONE;
    local_28.struct_def = type->struct_def;
    local_28.enum_def = type->enum_def;
    sVar1 = InlineSize(&local_28);
    sVar1 = type->fixed_length * sVar1;
  }
  return sVar1;
}

Assistant:

inline size_t InlineSize(const Type &type) {
  return IsStruct(type)
             ? type.struct_def->bytesize
             : (IsArray(type)
                    ? InlineSize(type.VectorType()) * type.fixed_length
                    : SizeOf(type.base_type));
}